

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          CappedArray<char,_14UL> *params_1,ArrayPtr<const_char> *params_2,StringTree *params_3,
          ArrayPtr<const_char> *params_4)

{
  Branch *pBVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Branch *pBVar4;
  char *pos;
  size_t sVar5;
  long lVar6;
  size_t result_2;
  char *local_88 [5];
  String local_60;
  StringTree *local_48;
  CappedArray<char,_14UL> *local_40;
  CappedArray<char,_14UL> *local_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_88[0] = (this->text).content.ptr;
  local_88[1] = params->ptr;
  local_88[2] = *(char **)params_1->content;
  local_88[3] = params_2->ptr;
  local_88[4] = (params_3->text).content.ptr;
  sVar5 = 0;
  lVar6 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)local_88 + lVar6);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x28);
  __return_storage_ptr__->size_ = sVar5;
  local_88[3] = (char *)0x0;
  sVar5 = 0;
  lVar6 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)local_88 + lVar6);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x28);
  local_48 = this;
  local_40 = (CappedArray<char,_14UL> *)params;
  local_38 = params_1;
  heapString(&local_60,sVar5);
  (__return_storage_ptr__->text).content.ptr = local_60.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_60.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_60.content.disposer;
  sVar5 = 0;
  local_88[2] = (char *)0x0;
  local_88[0] = (char *)0x0;
  local_88[1] = (char *)0x0;
  local_88[3] = (char *)0x1;
  local_88[4] = (char *)0x0;
  lVar6 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)local_88 + lVar6);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x28);
  pBVar4 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,sVar5,sVar5,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch>::construct,
                      ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  local_60.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar1 = (__return_storage_ptr__->branches).ptr;
  local_60.content.ptr = (char *)pBVar4;
  local_60.content.size_ = sVar5;
  if (pBVar1 != (Branch *)0x0) {
    sVar2 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar3 = (__return_storage_ptr__->branches).disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pBVar1,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = pBVar4;
  (__return_storage_ptr__->branches).size_ = sVar5;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,(ArrayPtr<const_char> *)local_48,local_40,
             (ArrayPtr<const_char> *)local_38,(StringTree *)params_2,
             (ArrayPtr<const_char> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}